

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_prepare_handshake_record(mbedtls_ssl_context *ssl)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  uint recv_msg_seq;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  uVar1 = ssl->in_msglen;
  sVar4 = mbedtls_ssl_hs_hdr_len(ssl);
  if (uVar1 < sVar4) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xbfe,"handshake message too short: %d",ssl->in_msglen);
    ssl_local._4_4_ = -0x7200;
  }
  else {
    sVar4 = mbedtls_ssl_hs_hdr_len(ssl);
    ssl->in_hslen =
         sVar4 + (long)(int)((uint)ssl->in_msg[1] << 0x10 | (uint)ssl->in_msg[2] << 8 |
                            (uint)ssl->in_msg[3]);
    sVar4 = ssl->in_hslen;
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0xc09,"handshake message: msglen = %d, type = %d, hslen = %d",ssl->in_msglen,
               (uint)*ssl->in_msg,sVar4);
    if ((*(uint *)&ssl->conf->field_0x164 >> 1 & 1) == 1) {
      uVar2 = (uint)CONCAT11(ssl->in_msg[4],ssl->in_msg[5]);
      if ((ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) &&
         (uVar2 != ssl->handshake->in_msg_seq)) {
        if ((uVar2 == ssl->handshake->in_flight_start_seq - 1) && (*ssl->in_msg != '\x03')) {
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0xc1e,
                     "received message from last flight, message_seq = %d, start_of_flight = %d",
                     (ulong)uVar2,ssl->handshake->in_flight_start_seq,sVar4);
          iVar3 = mbedtls_ssl_resend(ssl);
          if (iVar3 != 0) {
            mbedtls_debug_print_ret
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                       ,0xc22,"mbedtls_ssl_resend",iVar3);
            return iVar3;
          }
        }
        else {
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0xc2b,"dropping out-of-sequence message: message_seq = %d, expected = %d",
                     (ulong)uVar2,ssl->handshake->in_msg_seq,sVar4);
        }
        return -0x6900;
      }
      if ((((ssl->in_msglen < ssl->in_hslen) || (iVar3 = memcmp(ssl->in_msg + 6,"",3), iVar3 != 0))
          || (iVar3 = memcmp(ssl->in_msg + 9,ssl->in_msg + 1,3), iVar3 != 0)) ||
         ((ssl->handshake != (mbedtls_ssl_handshake_params *)0x0 &&
          (ssl->handshake->hs_msg != (uchar *)0x0)))) {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xc39,"found fragmented DTLS handshake message");
        iVar3 = ssl_reassemble_dtls_handshake(ssl);
        if (iVar3 != 0) {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0xc3d,"ssl_reassemble_dtls_handshake",iVar3);
          return iVar3;
        }
      }
    }
    else if (ssl->in_msglen < ssl->in_hslen) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xc47,"TLS handshake fragmentation not supported");
      return -0x7080;
    }
    if ((ssl->state != 0x10) && (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) {
      (*ssl->handshake->update_checksum)(ssl,ssl->in_msg,ssl->in_hslen);
    }
    if (((*(uint *)&ssl->conf->field_0x164 >> 1 & 1) == 1) &&
       (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) {
      ssl->handshake->in_msg_seq = ssl->handshake->in_msg_seq + 1;
    }
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_prepare_handshake_record( mbedtls_ssl_context *ssl )
{
    if( ssl->in_msglen < mbedtls_ssl_hs_hdr_len( ssl ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "handshake message too short: %d",
                            ssl->in_msglen ) );
        return( MBEDTLS_ERR_SSL_INVALID_RECORD );
    }

    ssl->in_hslen = mbedtls_ssl_hs_hdr_len( ssl ) + (
                    ( ssl->in_msg[1] << 16 ) |
                    ( ssl->in_msg[2] << 8  ) |
                      ssl->in_msg[3] );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "handshake message: msglen ="
                        " %d, type = %d, hslen = %d",
                        ssl->in_msglen, ssl->in_msg[0], ssl->in_hslen ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        int ret;
        unsigned int recv_msg_seq = ( ssl->in_msg[4] << 8 ) | ssl->in_msg[5];

        /* ssl->handshake is NULL when receiving ClientHello for renego */
        if( ssl->handshake != NULL &&
            recv_msg_seq != ssl->handshake->in_msg_seq )
        {
            /* Retransmit only on last message from previous flight, to avoid
             * too many retransmissions.
             * Besides, No sane server ever retransmits HelloVerifyRequest */
            if( recv_msg_seq == ssl->handshake->in_flight_start_seq - 1 &&
                ssl->in_msg[0] != MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "received message from last flight, "
                                    "message_seq = %d, start_of_flight = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_flight_start_seq ) );

                if( ( ret = mbedtls_ssl_resend( ssl ) ) != 0 )
                {
                    MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_resend", ret );
                    return( ret );
                }
            }
            else
            {
                MBEDTLS_SSL_DEBUG_MSG( 2, ( "dropping out-of-sequence message: "
                                    "message_seq = %d, expected = %d",
                                    recv_msg_seq,
                                    ssl->handshake->in_msg_seq ) );
            }

            return( MBEDTLS_ERR_SSL_WANT_READ );
        }
        /* Wait until message completion to increment in_msg_seq */

        /* Reassemble if current message is fragmented or reassembly is
         * already in progress */
        if( ssl->in_msglen < ssl->in_hslen ||
            memcmp( ssl->in_msg + 6, "\0\0\0",        3 ) != 0 ||
            memcmp( ssl->in_msg + 9, ssl->in_msg + 1, 3 ) != 0 ||
            ( ssl->handshake != NULL && ssl->handshake->hs_msg != NULL ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "found fragmented DTLS handshake message" ) );

            if( ( ret = ssl_reassemble_dtls_handshake( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_reassemble_dtls_handshake", ret );
                return( ret );
            }
        }
    }
    else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    /* With TLS we don't handle fragmentation (for now) */
    if( ssl->in_msglen < ssl->in_hslen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "TLS handshake fragmentation not supported" ) );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER &&
        ssl->handshake != NULL )
    {
        ssl->handshake->update_checksum( ssl, ssl->in_msg, ssl->in_hslen );
    }

    /* Handshake message is complete, increment counter */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL )
    {
        ssl->handshake->in_msg_seq++;
    }
#endif

    return( 0 );
}